

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O3

bool __thiscall V4L2Device::write_jpeg(V4L2Device *this,v4l2_buffer *bufferinfo)

{
  uint uVar1;
  Options *this_00;
  _func_int **pp_Var2;
  undefined8 uVar3;
  undefined1 uVar4;
  bool bVar5;
  OptionDetails *this_01;
  bool *pbVar6;
  Writer *pWVar7;
  int *piVar8;
  char *__s;
  size_t sVar9;
  bool bVar10;
  pointer *__ptr;
  undefined1 *puVar11;
  string jpeg_file_name;
  RawImagePtr image;
  fstream result;
  string local_2d0;
  Writer local_2b0;
  undefined1 local_240 [32];
  char *local_220;
  VerboseLevel local_218;
  Logger *local_210;
  bool local_208;
  Logger *local_200;
  char *local_1f8;
  DispatchAction local_1f0;
  pointer local_1e8;
  pointer pbStack_1e0;
  pointer local_1d8;
  
  uVar1 = bufferinfo->index;
  make_jpeg_file_name_abi_cxx11_(&local_2d0,this);
  if (local_2d0._M_string_length == 0) {
    local_240._0_8_ = &PTR__Writer_00162088;
    local_240._8_2_ = Error;
    local_240._16_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_240._24_8_ = 0x1c0;
    local_220 = "bool V4L2Device::write_jpeg(const struct v4l2_buffer &)";
    local_218 = 0;
    local_210 = (Logger *)0x0;
    local_208 = false;
    local_200 = (Logger *)0x0;
    local_1f8 = "";
    local_1f0 = NormalLog;
    local_1e8 = (pointer)0x0;
    pbStack_1e0 = (pointer)0x0;
    local_1d8 = (pointer)0x0;
    pWVar7 = el::base::Writer::construct((Writer *)local_240,1,"default");
    if (pWVar7->m_proceed == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar7->m_messageBuilder).m_logger)->field_0x50,
                 "couldn\'t create result file name",0x20);
      if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar7->m_messageBuilder).m_logger)->field_0x50," ",1);
      }
    }
    el::base::Writer::~Writer((Writer *)local_240);
    bVar10 = false;
    goto LAB_0014299b;
  }
  this_00 = (this->options).super___shared_ptr<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_240._0_8_ = (pointer)(local_240 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"save-jpeg-asis","");
  this_01 = cxxopts::Options::operator[](this_00,(string *)local_240);
  pbVar6 = cxxopts::OptionDetails::as<bool>(this_01);
  bVar10 = *pbVar6;
  if ((pointer)local_240._0_8_ != (pointer)(local_240 + 0x10)) {
    operator_delete((void *)local_240._0_8_);
  }
  if (bVar10 != false) {
    std::fstream::fstream(local_240,(string *)&local_2d0,_S_trunc|_S_out|_S_bin);
    if ((*(byte *)((long)&local_220 + (long)*(undefined **)(local_240._0_8_ + -0x18)) & 5) == 0) {
      bVar10 = true;
      std::ostream::write(local_240 + 0x10,(long)(this->buffers)._M_elems[uVar1].start);
    }
    else {
      local_2b0._vptr_Writer = (_func_int **)&PTR__Writer_00162088;
      local_2b0.m_level = Error;
      local_2b0.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
      ;
      local_2b0.m_line = 0x1c8;
      local_2b0.m_func = "bool V4L2Device::write_jpeg(const struct v4l2_buffer &)";
      local_2b0.m_verboseLevel = 0;
      local_2b0.m_logger = (Logger *)0x0;
      local_2b0.m_proceed = false;
      local_2b0.m_messageBuilder.m_logger = (Logger *)0x0;
      local_2b0.m_messageBuilder.m_containerLogSeperator = "";
      local_2b0.m_dispatchAction = NormalLog;
      local_2b0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2b0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pWVar7 = el::base::Writer::construct(&local_2b0,1,"default");
      if (pWVar7->m_proceed == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar7->m_messageBuilder).m_logger)->field_0x50,
                   "open file failed: ",0x12);
        if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&((pWVar7->m_messageBuilder).m_logger)->field_0x50," ",1);
        }
      }
      piVar8 = __errno_location();
      __s = strerror(*piVar8);
      if (pWVar7->m_proceed == true) {
        puVar11 = &((pWVar7->m_messageBuilder).m_logger)->field_0x50;
        if (__s == (char *)0x0) {
          std::ios::clear((int)puVar11 + (int)*(undefined8 *)(*(long *)puVar11 + -0x18));
        }
        else {
          sVar9 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar11,__s,sVar9);
        }
        if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&((pWVar7->m_messageBuilder).m_logger)->field_0x50," ",1);
        }
      }
      el::base::Writer::~Writer(&local_2b0);
      bVar10 = false;
    }
    std::fstream::~fstream(local_240);
    goto LAB_0014299b;
  }
  local_2b0._vptr_Writer = (_func_int **)0x0;
  decompress_jpeg((V4L2Device *)local_240,(v4l2_buffer *)this);
  uVar3 = local_240._0_8_;
  uVar4 = local_240[8];
  local_240._0_8_ = (pointer)0x0;
  std::__uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>::reset
            ((__uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_> *)
             &local_2b0,(pointer)uVar3);
  uVar3 = local_240._0_8_;
  if ((pointer)local_240._0_8_ != (pointer)0x0) {
    if (*(undefined **)local_240._0_8_ != (undefined *)0x0) {
      operator_delete__(*(undefined **)local_240._0_8_);
    }
    operator_delete((void *)uVar3);
  }
  if (uVar4 == 0) {
    local_240._0_8_ = &PTR__Writer_00162088;
    local_240._8_2_ = Error;
    local_240._16_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_240._24_8_ = 0x1de;
    local_220 = "bool V4L2Device::write_jpeg(const struct v4l2_buffer &)";
    local_218 = 0;
    local_210 = (Logger *)0x0;
    local_208 = false;
    local_200 = (Logger *)0x0;
    local_1f8 = "";
    local_1f0 = NormalLog;
    local_1e8 = (pointer)0x0;
    pbStack_1e0 = (pointer)0x0;
    local_1d8 = (pointer)0x0;
    pWVar7 = el::base::Writer::construct((Writer *)local_240,1,"default");
    if (pWVar7->m_proceed == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar7->m_messageBuilder).m_logger)->field_0x50,
                 "image decompression failed!",0x1b);
      if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar7->m_messageBuilder).m_logger)->field_0x50," ",1);
      }
    }
LAB_001428f2:
    el::base::Writer::~Writer((Writer *)local_240);
    bVar10 = false;
  }
  else {
    bVar5 = compress_jpeg(this,(RawImagePtr *)&local_2b0,&local_2d0);
    bVar10 = true;
    if (!bVar5) {
      local_240._0_8_ = &PTR__Writer_00162088;
      local_240._8_2_ = Error;
      local_240._16_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
      ;
      local_240._24_8_ = 0x1e4;
      local_220 = "bool V4L2Device::write_jpeg(const struct v4l2_buffer &)";
      local_218 = 0;
      local_210 = (Logger *)0x0;
      local_208 = false;
      local_200 = (Logger *)0x0;
      local_1f8 = "";
      local_1f0 = NormalLog;
      local_1e8 = (pointer)0x0;
      pbStack_1e0 = (pointer)0x0;
      local_1d8 = (pointer)0x0;
      pWVar7 = el::base::Writer::construct((Writer *)local_240,1,"default");
      if (pWVar7->m_proceed == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar7->m_messageBuilder).m_logger)->field_0x50,
                   "image compression failed!",0x19);
        if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&((pWVar7->m_messageBuilder).m_logger)->field_0x50," ",1);
        }
      }
      goto LAB_001428f2;
    }
  }
  pp_Var2 = local_2b0._vptr_Writer;
  if (local_2b0._vptr_Writer != (_func_int **)0x0) {
    if (*local_2b0._vptr_Writer != (_func_int *)0x0) {
      operator_delete__(*local_2b0._vptr_Writer);
    }
    operator_delete(pp_Var2);
  }
LAB_0014299b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  return bVar10;
}

Assistant:

bool
    write_jpeg(const struct v4l2_buffer& bufferinfo)
    {
        auto idx = bufferinfo.index;

        auto jpeg_file_name = make_jpeg_file_name();
        if (jpeg_file_name.empty()) {
            LOG(ERROR) << "couldn't create result file name";
            return false;
        }

        auto save_jpeg_asis = (*options)["save-jpeg-asis"].as<bool>();
        if (save_jpeg_asis) { // store jpeg as we have received it from the camera
            std::fstream result(jpeg_file_name, std::ios::binary | std::ios::out | std::ios::trunc);
            if (result.fail()) {
                LOG(ERROR) << "open file failed: " << strerror(errno);
                return false;
            }

            try {
                result.write(static_cast<const char*>(buffers[idx].start), bufferinfo.length);
            } catch (std::exception& exc) {
                LOG(ERROR) << "write file failed: " << exc.what();
                return false;
            }

            return true;
        }

        // (Re)compress JPEG

        bool ok;
        RawImagePtr image;

        try {
            std::tie(ok, image) = decompress_jpeg(bufferinfo);
            if (not ok) {
                LOG(ERROR) << "image decompression failed!";
                return false;
            }

            ok = compress_jpeg(image, jpeg_file_name);
            if (not ok) {
                LOG(ERROR) << "image compression failed!";
                return false;
            }
        } catch (std::exception& exc) {
            LOG(WARNING) << "image (de)compression failed: " << exc.what();
            return false;
        }

        return true;
    }